

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall cs_impl::fiber::Ordinator::~Ordinator(Ordinator *this)

{
  pointer ppRVar1;
  Routine *this_00;
  vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *__range2;
  Routine **routine;
  pointer ppRVar2;
  
  ppRVar1 = (this->routines).
            super__Vector_base<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar2 = (this->routines).
                 super__Vector_base<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppRVar2 != ppRVar1;
      ppRVar2 = ppRVar2 + 1) {
    this_00 = *ppRVar2;
    if (this_00 != (Routine *)0x0) {
      Routine::~Routine(this_00);
    }
    operator_delete(this_00,0x438);
  }
  std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear
            (&(this->indexes).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::
  ~_Vector_base((_Vector_base<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>
                 *)this);
  return;
}

Assistant:

inline ~Ordinator()
			{
				for (auto &routine: routines)
					delete routine;
			}